

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_config_preset(char *key,char *value)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_231;
  RuntimeConfig local_230;
  Log local_220;
  
  bVar1 = cali::Caliper::is_initialized();
  if (bVar1) {
    std::ofstream::ofstream(&local_220);
    local_220.m_level = 0;
    poVar2 = cali::Log::stream(&local_220);
    poVar2 = std::operator<<(poVar2,"Warning: Caliper is already initialized. ");
    poVar2 = std::operator<<(poVar2,"cali_config_preset(\"");
    poVar2 = std::operator<<(poVar2,key);
    poVar2 = std::operator<<(poVar2,"\", \"");
    poVar2 = std::operator<<(poVar2,value);
    poVar2 = std::operator<<(poVar2,"\") has no effect.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::~ofstream(&local_220);
  }
  cali::RuntimeConfig::get_default_config();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,value,&local_231);
  cali::RuntimeConfig::preset(&local_230,key,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_230.mP.
              super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void cali_config_preset(const char* key, const char* value)
{
    if (Caliper::is_initialized())
        Log(0).stream() << "Warning: Caliper is already initialized. "
                        << "cali_config_preset(\"" << key << "\", \"" << value << "\") has no effect." << std::endl;

    RuntimeConfig::get_default_config().preset(key, value);
}